

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::setWeekData(Calendar *this,Locale *desiredLocale,char *type,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  UResourceBundle *pUVar6;
  UResourceBundle *pUVar7;
  UCalendarDaysOfWeek *pUVar8;
  int32_t *weekDataArr;
  UResourceBundle *pUStack_540;
  int32_t arrLen;
  UResourceBundle *weekData;
  UResourceBundle *rb;
  char region [4];
  LocaleBased locBased;
  LocalUResourceBundlePointer monthNames;
  LocalUResourceBundlePointer calData;
  undefined1 local_428 [8];
  Locale max;
  char maxLocaleID [157];
  undefined1 local_290 [8];
  Locale useLocale;
  Locale min;
  char acStack_c8 [4];
  UErrorCode myStatus;
  char minLocaleID [157];
  UErrorCode *status_local;
  char *type_local;
  Locale *desiredLocale_local;
  Calendar *this_local;
  
  unique0x10000deb = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  this->fFirstDayOfWeek = UCAL_SUNDAY;
  this->fMinimalDaysInFirstWeek = '\x01';
  this->fWeekendOnset = UCAL_SATURDAY;
  this->fWeekendOnsetMillis = 0;
  this->fWeekendCease = UCAL_SUNDAY;
  this->fWeekendCeaseMillis = 86400000;
  minLocaleID[0x88] = '\0';
  minLocaleID[0x89] = '\0';
  minLocaleID[0x8a] = '\0';
  minLocaleID[0x8b] = '\0';
  minLocaleID[0x8c] = '\0';
  minLocaleID[0x8d] = '\0';
  minLocaleID[0x8e] = '\0';
  minLocaleID[0x8f] = '\0';
  minLocaleID[0x90] = '\0';
  minLocaleID[0x91] = '\0';
  minLocaleID[0x92] = '\0';
  minLocaleID[0x93] = '\0';
  minLocaleID[0x94] = '\0';
  minLocaleID[0x78] = '\0';
  minLocaleID[0x79] = '\0';
  minLocaleID[0x7a] = '\0';
  minLocaleID[0x7b] = '\0';
  minLocaleID[0x7c] = '\0';
  minLocaleID[0x7d] = '\0';
  minLocaleID[0x7e] = '\0';
  minLocaleID[0x7f] = '\0';
  minLocaleID[0x80] = '\0';
  minLocaleID[0x81] = '\0';
  minLocaleID[0x82] = '\0';
  minLocaleID[0x83] = '\0';
  minLocaleID[0x84] = '\0';
  minLocaleID[0x85] = '\0';
  minLocaleID[0x86] = '\0';
  minLocaleID[0x87] = '\0';
  minLocaleID[0x68] = '\0';
  minLocaleID[0x69] = '\0';
  minLocaleID[0x6a] = '\0';
  minLocaleID[0x6b] = '\0';
  minLocaleID[0x6c] = '\0';
  minLocaleID[0x6d] = '\0';
  minLocaleID[0x6e] = '\0';
  minLocaleID[0x6f] = '\0';
  minLocaleID[0x70] = '\0';
  minLocaleID[0x71] = '\0';
  minLocaleID[0x72] = '\0';
  minLocaleID[0x73] = '\0';
  minLocaleID[0x74] = '\0';
  minLocaleID[0x75] = '\0';
  minLocaleID[0x76] = '\0';
  minLocaleID[0x77] = '\0';
  minLocaleID[0x58] = '\0';
  minLocaleID[0x59] = '\0';
  minLocaleID[0x5a] = '\0';
  minLocaleID[0x5b] = '\0';
  minLocaleID[0x5c] = '\0';
  minLocaleID[0x5d] = '\0';
  minLocaleID[0x5e] = '\0';
  minLocaleID[0x5f] = '\0';
  minLocaleID[0x60] = '\0';
  minLocaleID[0x61] = '\0';
  minLocaleID[0x62] = '\0';
  minLocaleID[99] = '\0';
  minLocaleID[100] = '\0';
  minLocaleID[0x65] = '\0';
  minLocaleID[0x66] = '\0';
  minLocaleID[0x67] = '\0';
  minLocaleID[0x48] = '\0';
  minLocaleID[0x49] = '\0';
  minLocaleID[0x4a] = '\0';
  minLocaleID[0x4b] = '\0';
  minLocaleID[0x4c] = '\0';
  minLocaleID[0x4d] = '\0';
  minLocaleID[0x4e] = '\0';
  minLocaleID[0x4f] = '\0';
  minLocaleID[0x50] = '\0';
  minLocaleID[0x51] = '\0';
  minLocaleID[0x52] = '\0';
  minLocaleID[0x53] = '\0';
  minLocaleID[0x54] = '\0';
  minLocaleID[0x55] = '\0';
  minLocaleID[0x56] = '\0';
  minLocaleID[0x57] = '\0';
  minLocaleID[0x38] = '\0';
  minLocaleID[0x39] = '\0';
  minLocaleID[0x3a] = '\0';
  minLocaleID[0x3b] = '\0';
  minLocaleID[0x3c] = '\0';
  minLocaleID[0x3d] = '\0';
  minLocaleID[0x3e] = '\0';
  minLocaleID[0x3f] = '\0';
  minLocaleID[0x40] = '\0';
  minLocaleID[0x41] = '\0';
  minLocaleID[0x42] = '\0';
  minLocaleID[0x43] = '\0';
  minLocaleID[0x44] = '\0';
  minLocaleID[0x45] = '\0';
  minLocaleID[0x46] = '\0';
  minLocaleID[0x47] = '\0';
  minLocaleID[0x28] = '\0';
  minLocaleID[0x29] = '\0';
  minLocaleID[0x2a] = '\0';
  minLocaleID[0x2b] = '\0';
  minLocaleID[0x2c] = '\0';
  minLocaleID[0x2d] = '\0';
  minLocaleID[0x2e] = '\0';
  minLocaleID[0x2f] = '\0';
  minLocaleID[0x30] = '\0';
  minLocaleID[0x31] = '\0';
  minLocaleID[0x32] = '\0';
  minLocaleID[0x33] = '\0';
  minLocaleID[0x34] = '\0';
  minLocaleID[0x35] = '\0';
  minLocaleID[0x36] = '\0';
  minLocaleID[0x37] = '\0';
  minLocaleID[0x18] = '\0';
  minLocaleID[0x19] = '\0';
  minLocaleID[0x1a] = '\0';
  minLocaleID[0x1b] = '\0';
  minLocaleID[0x1c] = '\0';
  minLocaleID[0x1d] = '\0';
  minLocaleID[0x1e] = '\0';
  minLocaleID[0x1f] = '\0';
  minLocaleID[0x20] = '\0';
  minLocaleID[0x21] = '\0';
  minLocaleID[0x22] = '\0';
  minLocaleID[0x23] = '\0';
  minLocaleID[0x24] = '\0';
  minLocaleID[0x25] = '\0';
  minLocaleID[0x26] = '\0';
  minLocaleID[0x27] = '\0';
  minLocaleID[8] = '\0';
  minLocaleID[9] = '\0';
  minLocaleID[10] = '\0';
  minLocaleID[0xb] = '\0';
  minLocaleID[0xc] = '\0';
  minLocaleID[0xd] = '\0';
  minLocaleID[0xe] = '\0';
  minLocaleID[0xf] = '\0';
  minLocaleID[0x10] = '\0';
  minLocaleID[0x11] = '\0';
  minLocaleID[0x12] = '\0';
  minLocaleID[0x13] = '\0';
  minLocaleID[0x14] = '\0';
  minLocaleID[0x15] = '\0';
  minLocaleID[0x16] = '\0';
  minLocaleID[0x17] = '\0';
  _acStack_c8 = 0;
  minLocaleID[0] = '\0';
  minLocaleID[1] = '\0';
  minLocaleID[2] = '\0';
  minLocaleID[3] = '\0';
  minLocaleID[4] = '\0';
  minLocaleID[5] = '\0';
  minLocaleID[6] = '\0';
  minLocaleID[7] = '\0';
  min._220_4_ = 0;
  pcVar3 = Locale::getName(desiredLocale);
  uloc_minimizeSubtags_63(pcVar3,acStack_c8,0x9d,(UErrorCode *)&min.field_0xdc);
  Locale::createFromName((Locale *)&useLocale.fIsBogus,acStack_c8);
  Locale::Locale((Locale *)local_290);
  pcVar3 = Locale::getCountry(desiredLocale);
  sVar4 = strlen(pcVar3);
  if (sVar4 == 0) {
LAB_0020fad5:
    max.fIsBogus = '\0';
    max._217_7_ = 0;
    min._220_4_ = 0;
    pcVar3 = Locale::getName(desiredLocale);
    uloc_addLikelySubtags_63(pcVar3,&max.fIsBogus,0x9d,(UErrorCode *)&min.field_0xdc);
    Locale::createFromName((Locale *)local_428,&max.fIsBogus);
    pcVar3 = Locale::getLanguage((Locale *)local_428);
    pcVar5 = Locale::getCountry((Locale *)local_428);
    Locale::Locale((Locale *)&calData,pcVar3,pcVar5,(char *)0x0,(char *)0x0);
    Locale::operator=((Locale *)local_290,(Locale *)&calData);
    Locale::~Locale((Locale *)&calData);
    Locale::~Locale((Locale *)local_428);
  }
  else {
    pcVar3 = Locale::getScript(desiredLocale);
    sVar4 = strlen(pcVar3);
    if (sVar4 != 0) {
      pcVar3 = Locale::getScript((Locale *)&useLocale.fIsBogus);
      sVar4 = strlen(pcVar3);
      if (sVar4 == 0) goto LAB_0020fad5;
    }
    Locale::operator=((Locale *)local_290,desiredLocale);
  }
  pcVar3 = Locale::getBaseName((Locale *)local_290);
  pUVar6 = ures_open_63((char *)0x0,pcVar3,stack0xffffffffffffffd8);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer(&monthNames,pUVar6);
  pUVar6 = LocalPointerBase<UResourceBundle>::getAlias
                     (&monthNames.super_LocalPointerBase<UResourceBundle>);
  pUVar7 = LocalPointerBase<UResourceBundle>::getAlias
                     (&monthNames.super_LocalPointerBase<UResourceBundle>);
  ures_getByKey_63(pUVar6,"calendar",pUVar7,stack0xffffffffffffffd8);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&locBased.actual,(UResourceBundle *)0x0);
  if (((type != (char *)0x0) && (*type != '\0')) && (iVar2 = strcmp(type,"gregorian"), iVar2 != 0))
  {
    pUVar6 = LocalPointerBase<UResourceBundle>::getAlias
                       (&monthNames.super_LocalPointerBase<UResourceBundle>);
    pUVar6 = ures_getByKeyWithFallback_63
                       (pUVar6,type,(UResourceBundle *)0x0,stack0xffffffffffffffd8);
    LocalUResourceBundlePointer::adoptInstead
              ((LocalUResourceBundlePointer *)&locBased.actual,pUVar6);
    pUVar6 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&locBased.actual);
    pUVar7 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&locBased.actual);
    ures_getByKeyWithFallback_63(pUVar6,"monthNames",pUVar7,stack0xffffffffffffffd8);
  }
  UVar1 = LocalPointerBase<UResourceBundle>::isNull
                    ((LocalPointerBase<UResourceBundle> *)&locBased.actual);
  if ((UVar1 != '\0') || (*stack0xffffffffffffffd8 == U_MISSING_RESOURCE_ERROR)) {
    *stack0xffffffffffffffd8 = U_ZERO_ERROR;
    pUVar6 = LocalPointerBase<UResourceBundle>::getAlias
                       (&monthNames.super_LocalPointerBase<UResourceBundle>);
    pUVar7 = LocalPointerBase<UResourceBundle>::orphan
                       ((LocalPointerBase<UResourceBundle> *)&locBased.actual);
    pUVar6 = ures_getByKeyWithFallback_63(pUVar6,"gregorian",pUVar7,stack0xffffffffffffffd8);
    LocalUResourceBundlePointer::adoptInstead
              ((LocalUResourceBundlePointer *)&locBased.actual,pUVar6);
    pUVar6 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&locBased.actual);
    pUVar7 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&locBased.actual);
    ures_getByKeyWithFallback_63(pUVar6,"monthNames",pUVar7,stack0xffffffffffffffd8);
  }
  UVar1 = ::U_SUCCESS(*stack0xffffffffffffffd8);
  if (UVar1 == '\0') {
    *stack0xffffffffffffffd8 = U_ERROR_WARNING_START;
    rb._4_4_ = 1;
  }
  else {
    LocaleBased::LocaleBased((LocaleBased *)region,this->validLocale,this->actualLocale);
    pUVar6 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&locBased.actual);
    pcVar3 = ures_getLocaleByType_63(pUVar6,ULOC_VALID_LOCALE,stack0xffffffffffffffd8);
    pUVar6 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&locBased.actual);
    pcVar5 = ures_getLocaleByType_63(pUVar6,ULOC_ACTUAL_LOCALE,stack0xffffffffffffffd8);
    LocaleBased::setLocaleIDs((LocaleBased *)region,pcVar3,pcVar5);
    pcVar3 = Locale::getName(desiredLocale);
    ulocimp_getRegionForSupplementalData_63(pcVar3,'\x01',(char *)&rb,4,stack0xffffffffffffffd8);
    weekData = ures_openDirect_63((char *)0x0,"supplementalData",stack0xffffffffffffffd8);
    ures_getByKey_63(weekData,"weekData",weekData,stack0xffffffffffffffd8);
    pUStack_540 = ures_getByKey_63(weekData,(char *)&rb,(UResourceBundle *)0x0,
                                   stack0xffffffffffffffd8);
    if ((*stack0xffffffffffffffd8 == U_MISSING_RESOURCE_ERROR) &&
       (weekData != (UResourceBundle *)0x0)) {
      *stack0xffffffffffffffd8 = U_ZERO_ERROR;
      pUStack_540 = ures_getByKey_63(weekData,"001",(UResourceBundle *)0x0,stack0xffffffffffffffd8);
    }
    UVar1 = ::U_FAILURE(*stack0xffffffffffffffd8);
    if (UVar1 == '\0') {
      pUVar8 = (UCalendarDaysOfWeek *)
               ures_getIntVector_63
                         (pUStack_540,(int32_t *)((long)&weekDataArr + 4),stack0xffffffffffffffd8);
      UVar1 = ::U_SUCCESS(*stack0xffffffffffffffd8);
      if ((((((UVar1 == '\0') || (weekDataArr._4_4_ != 6)) || ((int)*pUVar8 < 1)) ||
           ((7 < (int)*pUVar8 || ((int)pUVar8[1] < 1)))) ||
          ((7 < (int)pUVar8[1] || (((int)pUVar8[2] < 1 || (7 < (int)pUVar8[2])))))) ||
         (((int)pUVar8[4] < 1 || (7 < (int)pUVar8[4])))) {
        *stack0xffffffffffffffd8 = U_INVALID_FORMAT_ERROR;
      }
      else {
        this->fFirstDayOfWeek = *pUVar8;
        this->fMinimalDaysInFirstWeek = (uint8_t)pUVar8[1];
        this->fWeekendOnset = pUVar8[2];
        this->fWeekendOnsetMillis = pUVar8[3];
        this->fWeekendCease = pUVar8[4];
        this->fWeekendCeaseMillis = pUVar8[5];
      }
    }
    else {
      *stack0xffffffffffffffd8 = U_ERROR_WARNING_START;
    }
    ures_close_63(pUStack_540);
    ures_close_63(weekData);
    rb._4_4_ = 0;
  }
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&locBased.actual);
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&monthNames);
  Locale::~Locale((Locale *)local_290);
  Locale::~Locale((Locale *)&useLocale.fIsBogus);
  return;
}

Assistant:

void
Calendar::setWeekData(const Locale& desiredLocale, const char *type, UErrorCode& status)
{

    if (U_FAILURE(status)) return;

    fFirstDayOfWeek = UCAL_SUNDAY;
    fMinimalDaysInFirstWeek = 1;
    fWeekendOnset = UCAL_SATURDAY;
    fWeekendOnsetMillis = 0;
    fWeekendCease = UCAL_SUNDAY;
    fWeekendCeaseMillis = 86400000; // 24*60*60*1000

    // Since week and weekend data is territory based instead of language based,
    // we may need to tweak the locale that we are using to try to get the appropriate
    // values, using the following logic:
    // 1). If the locale has a language but no territory, use the territory as defined by
    //     the likely subtags.
    // 2). If the locale has a script designation then we ignore it,
    //     then remove it ( i.e. "en_Latn_US" becomes "en_US" )

    char minLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };
    UErrorCode myStatus = U_ZERO_ERROR;

    uloc_minimizeSubtags(desiredLocale.getName(),minLocaleID,ULOC_FULLNAME_CAPACITY,&myStatus);
    Locale min = Locale::createFromName(minLocaleID);
    Locale useLocale;
    if ( uprv_strlen(desiredLocale.getCountry()) == 0 ||
         (uprv_strlen(desiredLocale.getScript()) > 0 && uprv_strlen(min.getScript()) == 0) ) {
        char maxLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };
        myStatus = U_ZERO_ERROR;
        uloc_addLikelySubtags(desiredLocale.getName(),maxLocaleID,ULOC_FULLNAME_CAPACITY,&myStatus);
        Locale max = Locale::createFromName(maxLocaleID);
        useLocale = Locale(max.getLanguage(),max.getCountry());
    } else {
        useLocale = desiredLocale;
    }

    /* The code here is somewhat of a hack, since week data and weekend data aren't really tied to
       a specific calendar, they aren't truly locale data.  But this is the only place where valid and
       actual locale can be set, so we take a shot at it here by loading a representative resource
       from the calendar data.  The code used to use the dateTimeElements resource to get first day
       of week data, but this was moved to supplemental data under ticket 7755. (JCE) */

    // Get the monthNames resource bundle for the calendar 'type'. Fallback to gregorian if the resource is not
    // found.
    LocalUResourceBundlePointer calData(ures_open(NULL, useLocale.getBaseName(), &status));
    ures_getByKey(calData.getAlias(), gCalendar, calData.getAlias(), &status);

    LocalUResourceBundlePointer monthNames;
    if (type != NULL && *type != '\0' && uprv_strcmp(type, gGregorian) != 0) {
        monthNames.adoptInstead(ures_getByKeyWithFallback(calData.getAlias(), type, NULL, &status));
        ures_getByKeyWithFallback(monthNames.getAlias(), gMonthNames,
                                  monthNames.getAlias(), &status);
    }

    if (monthNames.isNull() || status == U_MISSING_RESOURCE_ERROR) {
        status = U_ZERO_ERROR;
        monthNames.adoptInstead(ures_getByKeyWithFallback(calData.getAlias(), gGregorian,
                                                          monthNames.orphan(), &status));
        ures_getByKeyWithFallback(monthNames.getAlias(), gMonthNames,
                                  monthNames.getAlias(), &status);
    }

    if (U_SUCCESS(status)) {
        U_LOCALE_BASED(locBased,*this);
        locBased.setLocaleIDs(ures_getLocaleByType(monthNames.getAlias(), ULOC_VALID_LOCALE, &status),
                              ures_getLocaleByType(monthNames.getAlias(), ULOC_ACTUAL_LOCALE, &status));
    } else {
        status = U_USING_FALLBACK_WARNING;
        return;
    }

    char region[ULOC_COUNTRY_CAPACITY];
    (void)ulocimp_getRegionForSupplementalData(desiredLocale.getName(), TRUE, region, sizeof(region), &status);

    // Read week data values from supplementalData week data
    UResourceBundle *rb = ures_openDirect(NULL, "supplementalData", &status);
    ures_getByKey(rb, "weekData", rb, &status);
    UResourceBundle *weekData = ures_getByKey(rb, region, NULL, &status);
    if (status == U_MISSING_RESOURCE_ERROR && rb != NULL) {
        status = U_ZERO_ERROR;
        weekData = ures_getByKey(rb, "001", NULL, &status);
    }

    if (U_FAILURE(status)) {
        status = U_USING_FALLBACK_WARNING;
    } else {
        int32_t arrLen;
        const int32_t *weekDataArr = ures_getIntVector(weekData,&arrLen,&status);
        if( U_SUCCESS(status) && arrLen == 6
                && 1 <= weekDataArr[0] && weekDataArr[0] <= 7
                && 1 <= weekDataArr[1] && weekDataArr[1] <= 7
                && 1 <= weekDataArr[2] && weekDataArr[2] <= 7
                && 1 <= weekDataArr[4] && weekDataArr[4] <= 7) {
            fFirstDayOfWeek = (UCalendarDaysOfWeek)weekDataArr[0];
            fMinimalDaysInFirstWeek = (uint8_t)weekDataArr[1];
            fWeekendOnset = (UCalendarDaysOfWeek)weekDataArr[2];
            fWeekendOnsetMillis = weekDataArr[3];
            fWeekendCease = (UCalendarDaysOfWeek)weekDataArr[4];
            fWeekendCeaseMillis = weekDataArr[5];
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    ures_close(weekData);
    ures_close(rb);
}